

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bstrwrap.cpp
# Opt level: O1

CBString * __thiscall Bstrlib::CBString::operator=(CBString *this,CBString *b)

{
  int iVar1;
  int len;
  uchar *__dest;
  CBStringException *pCVar2;
  CBStringException bstr__cppwrapper_exception;
  string local_78;
  string local_58;
  CBStringException local_38;
  
  iVar1 = (this->super_tagbstring).mlen;
  if (iVar1 < 1) {
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_58,"CBString::Write protection error","");
    CBStringException::CBStringException(&local_38,&local_58);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    pCVar2 = (CBStringException *)__cxa_allocate_exception(0x28);
    CBStringException::CBStringException(pCVar2,&local_38);
    __cxa_throw(pCVar2,&CBStringException::typeinfo,CBStringException::~CBStringException);
  }
  len = (b->super_tagbstring).slen;
  if (iVar1 <= len) {
    alloc(this,len);
  }
  iVar1 = (b->super_tagbstring).slen;
  (this->super_tagbstring).slen = iVar1;
  __dest = (this->super_tagbstring).data;
  if (__dest != (uchar *)0x0) {
    memcpy(__dest,(b->super_tagbstring).data,(long)iVar1);
    (this->super_tagbstring).data[(this->super_tagbstring).slen] = '\0';
    return this;
  }
  (this->super_tagbstring).mlen = 0;
  (this->super_tagbstring).slen = 0;
  local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_78,"CBString::Failure in =(CBString) operator","");
  CBStringException::CBStringException(&local_38,&local_78);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._M_dataplus._M_p != &local_78.field_2) {
    operator_delete(local_78._M_dataplus._M_p);
  }
  pCVar2 = (CBStringException *)__cxa_allocate_exception(0x28);
  CBStringException::CBStringException(pCVar2,&local_38);
  __cxa_throw(pCVar2,&CBStringException::typeinfo,CBStringException::~CBStringException);
}

Assistant:

const CBString& CBString::operator = (const CBString& b) {
	if (mlen <= 0) bstringThrow ("Write protection error");
	if (b.slen >= mlen) alloc (b.slen);

	slen = b.slen;
	if (!data) {
		mlen = slen = 0;
		bstringThrow ("Failure in =(CBString) operator");
	} else {
		bstr__memcpy (data, b.data, slen);
		data[slen] = '\0';
	}
	return *this;
}